

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  undefined8 this_00;
  bool bVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar6;
  reference ppcVar7;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar8;
  string *psVar9;
  long lVar10;
  reference target;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  const_iterator fit;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string fastTarget;
  string local_220;
  char *local_200;
  char *editCommand;
  undefined1 local_1f0 [7];
  bool insertTarget;
  string targetName;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_1c8;
  const_iterator ti;
  undefined1 local_1b8 [6];
  bool topLevel;
  string currentDir;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_178;
  const_iterator it;
  string local_168;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  char *local_d0;
  char *homeOutputDir;
  string local_c0;
  undefined1 local_a0 [8];
  string makeArgs;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string make;
  cmMakefile *mf;
  cmGeneratedFileStream *fout_local;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  
  pcVar3 = cmLocalGenerator::GetMakefile(lg);
  make.field_2._8_8_ = pcVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CMAKE_MAKE_PROGRAM",&local_69);
  pcVar4 = cmMakefile::GetRequiredDefinition(pcVar3,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_48,pcVar4,(allocator *)(makeArgs.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(makeArgs.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  this_00 = make.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"CMAKE_KATE_MAKE_ARGUMENTS",(allocator *)((long)&homeOutputDir + 7)
            );
  pcVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)this_00,&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_a0,pcVar4,(allocator *)((long)&homeOutputDir + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&homeOutputDir + 6));
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&homeOutputDir + 7));
  local_d0 = cmLocalGenerator::GetBinaryDirectory(lg);
  poVar5 = std::operator<<((ostream *)fout,"\t\"build\": {\n\t\t\"directory\": \"");
  pcVar4 = cmLocalGenerator::GetBinaryDirectory(lg);
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::operator<<(poVar5,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n"
                 );
  poVar5 = std::operator<<((ostream *)fout,"\t\t\"build\": \"");
  poVar5 = std::operator<<(poVar5,(string *)local_48);
  poVar5 = std::operator<<(poVar5," -C \\\"");
  poVar5 = std::operator<<(poVar5,local_d0);
  poVar5 = std::operator<<(poVar5,"\\\" ");
  poVar5 = std::operator<<(poVar5,(string *)local_a0);
  poVar5 = std::operator<<(poVar5," ");
  std::operator<<(poVar5,"all\",\n");
  poVar5 = std::operator<<((ostream *)fout,"\t\t\"clean\": \"");
  poVar5 = std::operator<<(poVar5,(string *)local_48);
  poVar5 = std::operator<<(poVar5," -C \\\"");
  poVar5 = std::operator<<(poVar5,local_d0);
  poVar5 = std::operator<<(poVar5,"\\\" ");
  poVar5 = std::operator<<(poVar5,(string *)local_a0);
  poVar5 = std::operator<<(poVar5," ");
  std::operator<<(poVar5,"clean\",\n");
  poVar5 = std::operator<<((ostream *)fout,"\t\t\"quick\": \"");
  poVar5 = std::operator<<(poVar5,(string *)local_48);
  poVar5 = std::operator<<(poVar5," -C \\\"");
  poVar5 = std::operator<<(poVar5,local_d0);
  poVar5 = std::operator<<(poVar5,"\\\" ");
  poVar5 = std::operator<<(poVar5,(string *)local_a0);
  poVar5 = std::operator<<(poVar5," ");
  std::operator<<(poVar5,"install\",\n");
  std::operator<<((ostream *)fout,"\t\t\"targets\":[\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"all",&local_f1);
  pcVar4 = local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,pcVar4,&local_119);
  AppendTarget(this,fout,&local_f0,(string *)local_48,(string *)local_a0,&local_118,local_d0);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"clean",&local_141);
  pcVar4 = local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,pcVar4,(allocator *)((long)&it._M_current + 7));
  AppendTarget(this,fout,&local_140,(string *)local_48,(string *)local_a0,&local_168,local_d0);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  pvVar6 = cmGlobalGenerator::GetLocalGenerators
                     ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_178._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(pvVar6);
  while( true ) {
    pvVar6 = cmGlobalGenerator::GetLocalGenerators
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(pvVar6);
    bVar1 = __gnu_cxx::operator!=
                      (&local_178,
                       (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&targets.
                           super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    ppcVar7 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_178);
    __x = cmLocalGenerator::GetGeneratorTargets(*ppcVar7);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
               ((long)&currentDir.field_2 + 8),__x);
    ppcVar7 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_178);
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1b8,pcVar4,(allocator *)((long)&ti._M_current + 7))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&ti._M_current + 7));
    ppcVar7 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_178);
    pcVar4 = cmLocalGenerator::GetBinaryDirectory(*ppcVar7);
    ti._M_current._6_1_ =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8,pcVar4);
    local_1c8._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                    ((long)&currentDir.field_2 + 8));
    while( true ) {
      targetName.field_2._8_8_ =
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                      ((long)&currentDir.field_2 + 8));
      bVar1 = __gnu_cxx::operator!=
                        (&local_1c8,
                         (__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                          *)((long)&targetName.field_2 + 8));
      if (!bVar1) break;
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_1c8);
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar8);
      std::__cxx11::string::string((string *)local_1f0,(string *)psVar9);
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_1c8);
      TVar2 = cmGeneratorTarget::GetType(*ppcVar8);
      if (TVar2 < UTILITY) {
        AppendTarget(this,fout,(string *)local_1f0,(string *)local_48,(string *)local_a0,
                     (string *)local_1b8,local_d0);
        std::__cxx11::string::string
                  ((string *)
                   &objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1f0);
        std::__cxx11::string::operator+=
                  ((string *)
                   &objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"/fast");
        AppendTarget(this,fout,
                     (string *)
                     &objectFileTargets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_48,
                     (string *)local_a0,(string *)local_1b8,local_d0);
        std::__cxx11::string::~string
                  ((string *)
                   &objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else if (TVar2 == UTILITY) {
        lVar10 = std::__cxx11::string::find(local_1f0,0x90520f);
        if ((((lVar10 != 0) ||
             (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1f0,"Nightly"), !bVar1)) &&
            ((lVar10 = std::__cxx11::string::find(local_1f0,0x905217), lVar10 != 0 ||
             (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1f0,"Continuous"), !bVar1)))) &&
           ((lVar10 = std::__cxx11::string::find(local_1f0,0x905222), lVar10 != 0 ||
            (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1f0,"Experimental"), !bVar1)))) {
          AppendTarget(this,fout,(string *)local_1f0,(string *)local_48,(string *)local_a0,
                       (string *)local_1b8,local_d0);
        }
      }
      else if (TVar2 == GLOBAL_TARGET) {
        editCommand._7_1_ = 0;
        if ((ti._M_current._6_1_ & 1) != 0) {
          editCommand._7_1_ = 1;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1f0,"edit_cache");
          if (bVar1) {
            ppcVar7 = __gnu_cxx::
                      __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                      ::operator*(&local_178);
            pcVar3 = cmLocalGenerator::GetMakefile(*ppcVar7);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_220,"CMAKE_EDIT_COMMAND",
                       (allocator *)(fastTarget.field_2._M_local_buf + 0xf));
            pcVar4 = cmMakefile::GetDefinition(pcVar3,&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(fastTarget.field_2._M_local_buf + 0xf));
            local_200 = pcVar4;
            if (pcVar4 == (char *)0x0) {
              editCommand._7_1_ = 0;
            }
            else {
              pcVar4 = strstr(pcVar4,"ccmake");
              if (pcVar4 != (char *)0x0) {
                editCommand._7_1_ = 0;
              }
            }
          }
        }
        if ((editCommand._7_1_ & 1) != 0) {
          AppendTarget(this,fout,(string *)local_1f0,(string *)local_48,(string *)local_a0,
                       (string *)local_1b8,local_d0);
        }
      }
      std::__cxx11::string::~string((string *)local_1f0);
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_1c8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&fit);
    ppcVar7 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_178);
    cmLocalGenerator::GetIndividualFileTargets
              (*ppcVar7,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&fit);
    local_270._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fit);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_268,&local_270);
    while( true ) {
      local_278._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fit);
      bVar1 = __gnu_cxx::operator!=(&local_268,&local_278);
      if (!bVar1) break;
      target = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_268);
      AppendTarget(this,fout,target,(string *)local_48,(string *)local_a0,(string *)local_1b8,
                   local_d0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_268);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&fit);
    std::__cxx11::string::~string((string *)local_1b8);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
               ((long)&currentDir.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_178);
  }
  std::operator<<((ostream *)fout,"\t] }\n");
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void
cmExtraKateGenerator::WriteTargets(const cmLocalGenerator* lg,
                                   cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg->GetMakefile();
  const std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs = mf->GetSafeDefinition(
    "CMAKE_KATE_MAKE_ARGUMENTS");
  const char* homeOutputDir = lg->GetBinaryDirectory();

  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << lg->GetBinaryDirectory() << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "install\",\n";

  // this is for kate >= 4.13:
  fout <<
  "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs,
                     homeOutputDir, homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs,
                     homeOutputDir, homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator
       it = this->GlobalGenerator->GetLocalGenerators().begin();
       it != this->GlobalGenerator->GetLocalGenerators().end();
       ++it)
    {
    const std::vector<cmGeneratorTarget*> targets =
        (*it)->GetGeneratorTargets();
    std::string currentDir = (*it)->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == (*it)->GetBinaryDirectory());

    for(std::vector<cmGeneratorTarget*>::const_iterator ti =
        targets.begin(); ti!=targets.end(); ++ti)
      {
      std::string targetName = (*ti)->GetName();
      switch((*ti)->GetType())
        {
        case cmState::GLOBAL_TARGET:
          {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel)
            {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache")
              {
              const char* editCommand = (*it)->GetMakefile()->GetDefinition
              ("CMAKE_EDIT_COMMAND");
              if (editCommand == 0)
                {
                insertTarget = false;
                }
              else if (strstr(editCommand, "ccmake")!=NULL)
                {
                insertTarget = false;
                }
              }
            }
          if (insertTarget)
            {
            this->AppendTarget(fout, targetName, make, makeArgs,
                               currentDir, homeOutputDir);
            }
        }
        break;
        case cmState::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly")==0)   &&(targetName!="Nightly"))
            || ((targetName.find("Continuous")==0)
                &&(targetName!="Continuous"))
            || ((targetName.find("Experimental")==0)
            && (targetName!="Experimental")))
            {
              break;
            }

            this->AppendTarget(fout, targetName, make, makeArgs,
                               currentDir, homeOutputDir);
          break;
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
        {
          this->AppendTarget(fout, targetName, make, makeArgs,
                             currentDir, homeOutputDir);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, make, makeArgs,
                             currentDir, homeOutputDir);

        }
        break;
        default:
          break;
      }
    }

    //insert rules for compiling, preprocessing and assembling individual files
    std::vector<std::string> objectFileTargets;
    (*it)->GetIndividualFileTargets(objectFileTargets);
    for(std::vector<std::string>::const_iterator fit=objectFileTargets.begin();
        fit != objectFileTargets.end();
        ++fit)
      {
      this->AppendTarget(fout, *fit, make, makeArgs, currentDir,homeOutputDir);
      }
  }

  fout <<
  "\t] }\n";
}